

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O1

bool __thiscall Common::check(Common *this,TaskHandle *head)

{
  pointer psVar1;
  element_type *peVar2;
  pointer pOVar3;
  element_type *peVar4;
  int iVar5;
  shared_ptr<Operand> *operand;
  pointer psVar6;
  _Rb_tree_node_base *p_Var7;
  pointer pOVar8;
  size_type sVar9;
  vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_> *__range1;
  ulong uVar10;
  char *fmt;
  key_type *__x;
  TaskHandle task;
  element_type *local_28;
  element_type *local_20;
  
  psVar1 = (this->operands).
           super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (this->operands).
                super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar1; psVar6 = psVar6 + 1) {
    peVar2 = (psVar6->super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    peVar2->on_device = false;
    peVar2->occurred = false;
  }
  for (p_Var7 = (this->already_on)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &(this->already_on)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    *(undefined1 *)(*(long *)(p_Var7 + 1) + 0x20) = 1;
  }
  local_28 = (head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_20 = (element_type *)
             (head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_20 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_20->id = local_20->id + 1;
      UNLOCK();
    }
    else {
      local_20->id = local_20->id + 1;
    }
  }
  if (local_28 != (element_type *)0x0) {
    __x = (key_type *)&local_20;
    do {
      iVar5 = std::__cxx11::string::compare((char *)&local_28->name);
      if (iVar5 == 0) {
        pOVar3 = (local_28->outs).super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pOVar8 = (local_28->outs).
                      super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
                      super__Vector_impl_data._M_start; pOVar8 != pOVar3; pOVar8 = pOVar8 + 1) {
          peVar2 = (pOVar8->operand).super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (peVar2->on_device == false) {
            uVar10 = (ulong)(uint)peVar2->id;
            fmt = "Operand %d not on device (.dealloc)\n";
            goto LAB_0011ab71;
          }
          peVar2->on_device = false;
        }
      }
      else {
        for (pOVar8 = (local_28->ins).
                      super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pOVar8 != (local_28->ins).
                      super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
                      super__Vector_impl_data._M_finish; pOVar8 = pOVar8 + 1) {
          peVar2 = (pOVar8->operand).super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (peVar2->on_device == false) {
            uVar10 = (ulong)(uint)peVar2->id;
            fmt = "Operand %d not on device (normal operators)\n";
            goto LAB_0011ab71;
          }
        }
        pOVar3 = (local_28->outs).super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pOVar8 = (local_28->outs).
                      super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
                      super__Vector_impl_data._M_start; pOVar8 != pOVar3; pOVar8 = pOVar8 + 1) {
          ((pOVar8->operand).super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          on_device = true;
        }
      }
      peVar4 = (local_28->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)__x,
                 &(local_28->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      local_28 = peVar4;
    } while (peVar4 != (element_type *)0x0);
  }
  if (local_20 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20);
  }
  __x = (this->operands).
        super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>.
        _M_impl.super__Vector_impl_data._M_start;
  psVar6 = (this->operands).
           super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (__x != psVar6) {
    do {
      if (((__x->super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->on_device == true
         ) {
        sVar9 = std::
                set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
                ::count(&this->not_dealloc,__x);
        if (sVar9 == 0) goto LAB_0011ab78;
      }
      if (((__x->super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->on_device ==
          false) {
        sVar9 = std::
                set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
                ::count(&this->not_dealloc,__x);
        if (sVar9 != 0) {
          uVar10 = (ulong)(uint)((__x->super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr)->id;
          fmt = "Operand %d has been dealloc but should not\n";
LAB_0011ab71:
          do {
            error(fmt,uVar10);
LAB_0011ab78:
            uVar10 = (ulong)(uint)((__x->super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr)->id;
            fmt = "Forget to dealloc %d\n";
          } while( true );
        }
      }
      __x = __x + 1;
    } while (__x != psVar6);
  }
  return true;
}

Assistant:

bool check(TaskHandle &head) const {
        // Clear status
        for (auto &operand: operands) {
            operand->clear();
        }
        for (auto &operand: already_on) {
            operand->on_device = true;
        }

        // Simulate and check
        LOOP(task, head) {
            if (task->isDealloc()) {
                for (auto &usage: task->outs) {
                    if (not usage.operand->on_device) {
                        error("Operand %d not on device (.dealloc)\n", usage.operand->id);
                        return false;
                    }
                    usage.operand->on_device = false;
                }
            } else {
                for (auto &usage: task->ins) {
                    if (not usage.operand->on_device) {
                        error("Operand %d not on device (normal operators)\n", usage.operand->id);
                        return false;
                    }
                }
                for (auto &usage: task->outs) {
                    usage.operand->on_device = true;
                }
            }
        }

        // Check final status
        for (auto &operand: operands) {
            if (operand->on_device and not not_dealloc.count(operand)) {
                error("Forget to dealloc %d\n", operand->id);
                return false;
            }
            if (not operand->on_device and not_dealloc.count(operand)) {
                error("Operand %d has been dealloc but should not\n", operand->id);
                return false;
            }
        }
        return true;
    }